

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_pop_unused(REF_NODE ref_node,REF_GLOB *new_global)

{
  bool bVar1;
  REF_GLOB *new_global_local;
  REF_NODE ref_node_local;
  
  bVar1 = ref_node->n_unused != 0;
  if (bVar1) {
    ref_node->n_unused = ref_node->n_unused + -1;
    *new_global = ref_node->unused_global[ref_node->n_unused];
  }
  else {
    *new_global = -1;
  }
  ref_node_local._4_4_ = (uint)!bVar1;
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_pop_unused(REF_NODE ref_node,
                                       REF_GLOB *new_global) {
  if (0 == ref_node_n_unused(ref_node)) {
    *new_global = REF_EMPTY;
    return REF_FAILURE;
  }

  ref_node_n_unused(ref_node)--;
  *new_global = ref_node->unused_global[ref_node_n_unused(ref_node)];

  return REF_SUCCESS;
}